

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckInt(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,int64_t i)

{
  ushort uVar1;
  bool bVar2;
  ValueType *actualType;
  int64_t iVar3;
  Ch *pCVar4;
  uint64_t uVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ValidateErrorCode validateErrorCode;
  ulong uVar6;
  
  if ((this->type_ & 0x60) == 0) {
    actualType = GetIntegerString();
    DisallowedType(this,context,actualType);
    context->invalidCode = kValidateErrorType;
    this_00 = GetTypeString();
    goto LAB_0014ef32;
  }
  uVar1 = (this->minimum_).data_.f.flags;
  if (uVar1 == 0) {
LAB_0014eeb5:
    uVar1 = (this->maximum_).data_.f.flags;
    if (uVar1 != 0) {
      if ((char)uVar1 < '\0') {
        bVar2 = this->exclusiveMaximum_;
        iVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64
                          (&this->maximum_);
        if (bVar2 == true) {
          if (iVar3 <= i) {
LAB_0014ef07:
            (*context->error_handler->_vptr_IValidationErrorHandler[5])
                      (context->error_handler,i,&this->maximum_,(ulong)this->exclusiveMaximum_);
            validateErrorCode = (uint)this->exclusiveMaximum_ | kValidateErrorMaximum;
            goto LAB_0014ef2a;
          }
        }
        else if (iVar3 < i) goto LAB_0014ef07;
      }
      else if (((uVar1 >> 8 & 1) == 0) &&
              (bVar2 = CheckDoubleMaximum(this,context,(double)i), !bVar2)) {
        return false;
      }
    }
    uVar1 = (this->multipleOf_).data_.f.flags;
    if (uVar1 == 0) {
      return true;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      bVar2 = CheckDoubleMultipleOf(this,context,(double)i);
      if (!bVar2) {
        return false;
      }
      return true;
    }
    uVar6 = -i;
    if (0 < i) {
      uVar6 = i;
    }
    uVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                      (&this->multipleOf_);
    if (uVar6 % uVar5 == 0) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[2])
              (context->error_handler,i,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetMultipleOfString();
  }
  else {
    if (-1 < (char)uVar1) {
      if ((uVar1 >> 8 & 1) != 0) goto LAB_0014ee8b;
      bVar2 = CheckDoubleMinimum(this,context,(double)i);
      if (!bVar2) {
        return false;
      }
      goto LAB_0014eeb5;
    }
    bVar2 = this->exclusiveMinimum_;
    iVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64(&this->minimum_);
    if (bVar2 == true) {
      if (iVar3 < i) goto LAB_0014eeb5;
    }
    else if (iVar3 <= i) goto LAB_0014eeb5;
LAB_0014ee8b:
    (*context->error_handler->_vptr_IValidationErrorHandler[8])
              (context->error_handler,i,&this->minimum_,(ulong)this->exclusiveMinimum_);
    validateErrorCode = (uint)this->exclusiveMinimum_ | kValidateErrorMinimum;
LAB_0014ef2a:
    context->invalidCode = validateErrorCode;
    this_00 = GetValidateErrorKeyword(validateErrorCode);
  }
LAB_0014ef32:
  pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar4;
  return false;
}

Assistant:

bool CheckInt(Context& context, int64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsInt64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetInt64() : i < minimum_.GetInt64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsUint64()) {
                context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum); // i <= max(int64_t) < minimum.GetUint64()
            }
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsInt64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetInt64() : i > maximum_.GetInt64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsUint64()) { }
                /* do nothing */ // i <= max(int64_t) < maximum_.GetUint64()
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (static_cast<uint64_t>(i >= 0 ? i : -i) % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }